

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O1

void mul_mat_gq_5(void *src0,void *src1,float *dst,int m,int n,int k)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if ((k & 0x3fU) == 0) {
    if (0 < m) {
      iVar1 = (k >> 4) * 9;
      iVar2 = 0;
      do {
        if (0 < n) {
          lVar3 = 0;
          do {
            vec_dot_gq_5(k,(float *)(lVar3 + (long)dst),src0,src1);
            src1 = (void *)((long)src1 + (long)iVar1);
            lVar3 = lVar3 + 4;
          } while ((ulong)(uint)n << 2 != lVar3);
        }
        src1 = (void *)((long)src1 - (long)(iVar1 * n));
        src0 = (void *)((long)src0 + (long)iVar1);
        iVar2 = iVar2 + 1;
        dst = dst + n;
      } while (iVar2 != m);
    }
    return;
  }
  __assert_fail("k % QK == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                ,0x7c2,"void mul_mat_gq_5(const void *, const void *, float *, int, int, int)");
}

Assistant:

void mul_mat_gq_5(
    const void * src0,
    const void * src1, // transposed
         float * dst,
    int m, int n, int k) {
    assert(k % QK == 0);

    const int nb = quantize_5_blocks_per_row(k);

    for (int ir0 = 0; ir0 < m; ir0++) {
        for (int ir1 = 0; ir1 < n; ir1++) {
            vec_dot_gq_5(k, dst + ir1, src0, src1);
            src1 = (const char *) src1 + quantize_5_row_size(k);
        }
        src0 = (const char *) src0 +   quantize_5_row_size(k);
        src1 = (const char *) src1 - n*quantize_5_row_size(k);

        dst = (float *) dst + n;
    }
}